

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_v2_local.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  long lVar2;
  uint8_t *message_dec;
  uint8_t *footer;
  size_t footer_len;
  size_t message_len_dec;
  char *enc;
  size_t foot_len;
  undefined8 uStack_38;
  uint8_t foot [7];
  size_t message_len;
  undefined1 local_28 [3];
  uint8_t message [5];
  uint8_t key [32];
  
  uVar1 = paseto_init();
  if ((uVar1 & 1) == 0) {
    fprintf(_stderr,"Failed to initialize libpaseto\n");
    exit(-1);
  }
  uVar1 = paseto_v2_local_load_key_base64(local_28,"jPGxsBcnjnruJJe3cF4dnjo1LVM-g8O6ktboqggzi2c");
  if ((uVar1 & 1) == 0) {
    perror("Failed to load key");
    exit(-1);
  }
  message_len._3_4_ = 0x74736574;
  message_len._7_1_ = 0;
  uStack_38 = 4;
  foot_len._1_4_ = 0x746f6f66;
  foot_len._5_2_ = 0x7265;
  foot_len._7_1_ = 0;
  enc = (char *)0x6;
  message_len_dec = paseto_v2_local_encrypt((long)&message_len + 3,4,local_28,(long)&foot_len + 1,6)
  ;
  if (message_len_dec == 0) {
    perror("paseto_v2_local_encrypt failed");
    exit(-1);
  }
  printf("encrypted: %s\n",message_len_dec);
  footer_len = 0;
  footer = (uint8_t *)0x0;
  lVar2 = paseto_v2_local_decrypt(message_len_dec,&footer_len,local_28,&message_dec,&footer);
  if (lVar2 == 0) {
    perror("paseto_v2_local_decrypt failed");
    exit(-1);
  }
  paseto_free(message_len_dec);
  printf("decrypted: %s\nfooter: %s\n",lVar2,message_dec);
  paseto_free(lVar2);
  return 0;
}

Assistant:

int main() {
    if (!paseto_init()) {
        fprintf(stderr, "Failed to initialize libpaseto\n");
        exit(-1);
    }

    uint8_t key[paseto_v2_LOCAL_KEYBYTES];
    if (!paseto_v2_local_load_key_base64(key,
            "jPGxsBcnjnruJJe3cF4dnjo1LVM-g8O6ktboqggzi2c")) {
        perror("Failed to load key");
        exit(-1);
    }
    const uint8_t message[] = "test";
    size_t message_len = sizeof(message) - 1;
    const uint8_t foot[] = "footer";
    size_t foot_len = sizeof(foot) - 1;
    char *enc = paseto_v2_local_encrypt(
            message, message_len, key, foot, foot_len);
    if (!enc) {
        perror("paseto_v2_local_encrypt failed");
        exit(-1);
    }
    printf("encrypted: %s\n", enc);

    size_t message_len_dec = 0;
    size_t footer_len = 0;
    uint8_t *footer;
    uint8_t *message_dec = paseto_v2_local_decrypt(
            enc, &message_len_dec, key, &footer, &footer_len);
    if (!message_dec) {
        perror("paseto_v2_local_decrypt failed");
        exit(-1);
    }
    paseto_free(enc);
    printf("decrypted: %s\nfooter: %s\n", message_dec, footer);
    paseto_free(message_dec);
}